

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiAreaPrivate::updateScrollBars(QMdiAreaPrivate *this)

{
  QWidget *this_00;
  Data *pDVar1;
  Representation RVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Representation RVar7;
  LayoutDirection LVar8;
  int iVar9;
  QSize QVar10;
  int extraout_var;
  QStyle *pQVar11;
  int iVar12;
  int step;
  Representation RVar13;
  uint uVar14;
  Representation RVar15;
  bool bVar16;
  QRect QVar17;
  int local_50;
  
  if ((this->ignoreGeometryChange == false) &&
     (((this->super_QAbstractScrollAreaPrivate).hbarpolicy != ScrollBarAlwaysOff ||
      ((this->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOff)))) {
    this_00 = *(QWidget **)
               &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
                field_0x8;
    QVar10 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)this_00);
    local_50 = (int)QVar10.ht.m_i;
    (**(code **)(*(long *)&(((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider).
                           super_QWidget + 0x70))();
    iVar5 = (**(code **)(*(long *)&(((this->super_QAbstractScrollAreaPrivate).vbar)->
                                   super_QAbstractSlider).super_QWidget + 0x70))();
    pQVar11 = QWidget::style(this_00);
    iVar6 = (**(code **)(*(long *)pQVar11 + 0xf0))(pQVar11,0x11,0,this_00,0);
    iVar12 = extraout_var;
    if (iVar6 != 0) {
      iVar6 = (int)(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth;
      iVar12 = 0;
      if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOn) {
        iVar12 = iVar6 * 2;
      }
      local_50 = local_50 - iVar12;
      iVar12 = 0;
      if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOn) {
        iVar12 = iVar6 * 2;
      }
      QVar10.wd.m_i = QVar10.wd.m_i.m_i - iVar12;
      QVar10.ht.m_i = 0;
      iVar12 = extraout_var + iVar6 * 2;
      iVar5 = iVar5 + iVar6 * 2;
    }
    pDVar1 = (this->active).wp.d;
    if ((((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
        ((this->active).wp.value == (QObject *)0x0)) ||
       (bVar4 = QWidget::isMaximized((QWidget *)(this->active).wp.value), !bVar4)) {
      QVar17 = QWidget::childrenRect((this->super_QAbstractScrollAreaPrivate).viewport);
    }
    else {
      QVar17 = *(QRect *)(*(long *)((this->active).wp.value + 0x20) + 0x14);
    }
    RVar13 = QVar17.x2.m_i;
    RVar7 = QVar17.x1.m_i;
    step = (RVar13.m_i - RVar7.m_i) + 1;
    RVar15 = QVar10.wd.m_i;
    bVar4 = (RVar15.m_i <= RVar13.m_i || RVar7.m_i < 0) || RVar15.m_i < step;
    RVar2 = QVar17.y2.m_i;
    iVar6 = (RVar2.m_i + 1) - QVar17.y1.m_i;
    bVar16 = QVar17._0_8_ < 0;
    bVar3 = (local_50 <= RVar2.m_i || bVar16) || local_50 < iVar6;
    if (((local_50 > RVar2.m_i && !bVar16) && local_50 >= iVar6) &&
       ((RVar15.m_i <= RVar13.m_i || RVar7.m_i < 0) || RVar15.m_i < step)) {
      bVar3 = local_50 - iVar12 <= RVar2.m_i || local_50 - iVar12 < iVar6;
    }
    if (!(bool)(bVar3 ^ 1U | bVar4)) {
      bVar4 = RVar15.m_i - iVar5 <= RVar13.m_i || RVar15.m_i - iVar5 < step;
    }
    if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOn) {
      iVar12 = 0;
    }
    if (!bVar4) {
      iVar12 = 0;
    }
    if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAlwaysOn) {
      iVar5 = 0;
    }
    if (!bVar3) {
      iVar5 = 0;
    }
    LVar8 = QWidget::layoutDirection(this_00);
    RVar13.m_i = ~RVar13.m_i + (RVar15.m_i - iVar5);
    if (LVar8 == LeftToRight) {
      RVar13.m_i = RVar7.m_i;
    }
    if ((this->isSubWindowsTiled == true) &&
       (iVar9 = QAbstractSlider::value
                          (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider),
       iVar9 != 0)) {
      QAbstractSlider::setValue
                (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0);
    }
    iVar9 = QAbstractSlider::value
                      (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    uVar14 = RVar13.m_i + iVar9;
    iVar9 = (step - (RVar15.m_i - iVar5)) + uVar14;
    iVar5 = 0;
    if (0 < iVar9) {
      iVar5 = iVar9;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,
               (int)uVar14 >> 0x1f & uVar14,iVar5);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,step);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,step / 0x14);
    if ((this->isSubWindowsTiled == true) &&
       (iVar5 = QAbstractSlider::value
                          (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider),
       iVar5 != 0)) {
      QAbstractSlider::setValue
                (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0);
    }
    iVar5 = QAbstractSlider::value
                      (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider);
    uVar14 = QVar17.y1.m_i.m_i + iVar5;
    iVar12 = ((RVar2.m_i + 1) - local_50) + iVar5 + iVar12;
    iVar5 = 0;
    if (0 < iVar12) {
      iVar5 = iVar12;
    }
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,
               (int)uVar14 >> 0x1f & uVar14,iVar5);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar6);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar6 / 0x14)
    ;
    return;
  }
  return;
}

Assistant:

void QMdiAreaPrivate::updateScrollBars()
{
    if (ignoreGeometryChange || !scrollBarsEnabled())
        return;

    Q_Q(QMdiArea);
    QSize maxSize = q->maximumViewportSize();
    QSize hbarExtent = hbar->sizeHint();
    QSize vbarExtent = vbar->sizeHint();

    if (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q)) {
        const int doubleFrameWidth = frameWidth * 2;
        if (hbarpolicy == Qt::ScrollBarAlwaysOn)
            maxSize.rheight() -= doubleFrameWidth;
        if (vbarpolicy == Qt::ScrollBarAlwaysOn)
            maxSize.rwidth() -= doubleFrameWidth;
        hbarExtent.rheight() += doubleFrameWidth;
        vbarExtent.rwidth() += doubleFrameWidth;
    }

    const QRect childrenRect = active && active->isMaximized()
                               ? active->geometry() : viewport->childrenRect();
    bool useHorizontalScrollBar = useScrollBar(childrenRect, maxSize, Qt::Horizontal);
    bool useVerticalScrollBar = useScrollBar(childrenRect, maxSize, Qt::Vertical);

    if (useHorizontalScrollBar && !useVerticalScrollBar) {
        const QSize max = maxSize - QSize(0, hbarExtent.height());
        useVerticalScrollBar = useScrollBar(childrenRect, max, Qt::Vertical);
    }

    if (useVerticalScrollBar && !useHorizontalScrollBar) {
        const QSize max = maxSize - QSize(vbarExtent.width(), 0);
        useHorizontalScrollBar = useScrollBar(childrenRect, max, Qt::Horizontal);
    }

    if (useHorizontalScrollBar && hbarpolicy != Qt::ScrollBarAlwaysOn)
        maxSize.rheight() -= hbarExtent.height();
    if (useVerticalScrollBar && vbarpolicy != Qt::ScrollBarAlwaysOn)
        maxSize.rwidth() -= vbarExtent.width();

    QRect viewportRect(QPoint(0, 0), maxSize);
    const int startX = q->isLeftToRight() ? childrenRect.left() : viewportRect.right()
                                                                  - childrenRect.right();

    // Horizontal scroll bar.
    if (isSubWindowsTiled && hbar->value() != 0)
        hbar->setValue(0);
    const int xOffset = startX + hbar->value();
    hbar->setRange(qMin(0, xOffset),
                   qMax(0, xOffset + childrenRect.width() - viewportRect.width()));
    hbar->setPageStep(childrenRect.width());
    hbar->setSingleStep(childrenRect.width() / 20);

    // Vertical scroll bar.
    if (isSubWindowsTiled && vbar->value() != 0)
        vbar->setValue(0);
    const int yOffset = childrenRect.top() + vbar->value();
    vbar->setRange(qMin(0, yOffset),
                   qMax(0, yOffset + childrenRect.height() - viewportRect.height()));
    vbar->setPageStep(childrenRect.height());
    vbar->setSingleStep(childrenRect.height() / 20);
}